

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O0

long __thiscall
cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
::fill_internal_duplex
          (cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
           *this,float *in_buffer,long *input_frames_count,float *out_buffer,
          long output_frames_needed)

{
  uint32_t uVar1;
  float *output_buffer;
  size_t *in_RDX;
  size_t in_RSI;
  cubeb_resampler_speex_one_way<float> *in_RDI;
  size_t frames_resampled;
  long got;
  long output_frames_before_processing;
  float *out_unprocessed;
  float *resampled_input;
  float *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  cubeb_resampler_speex_one_way<float> *this_00;
  float *in_stack_ffffffffffffffb8;
  cubeb_resampler_speex_one_way<float> *pcVar2;
  cubeb_resampler_speex_one_way<float> *in_stack_ffffffffffffffc0;
  float *local_38;
  cubeb_resampler_speex_one_way<float> *this_01;
  cubeb_resampler_speex_one_way<float> *local_8;
  
  if (((in_RDI->resampling_out_buffer).capacity_ & 1) == 0) {
    pcVar2 = (cubeb_resampler_speex_one_way<float> *)0x0;
    this_00 = (cubeb_resampler_speex_one_way<float> *)0x0;
    this_01 = in_RDI;
    std::
    unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                  *)0x119ae9);
    uVar1 = cubeb_resampler_speex_one_way<float>::input_needed_for_output
                      (pcVar2,(int32_t)((ulong)this_00 >> 0x20));
    output_buffer = (float *)(ulong)uVar1;
    std::
    unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                  *)0x119b0d);
    pcVar2 = (cubeb_resampler_speex_one_way<float> *)
             cubeb_resampler_speex_one_way<float>::input_buffer
                       (this_00,(size_t)in_stack_ffffffffffffffa8);
    if (in_RSI == 0) {
      local_38 = (float *)0x0;
    }
    else {
      std::
      unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
      ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                    *)0x119b35);
      cubeb_resampler_speex_one_way<float>::input(this_00,in_stack_ffffffffffffffa8,(size_t)in_RDI);
      in_stack_ffffffffffffffa8 = (float *)0x0;
      std::
      unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
      ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                    *)0x119b61);
      local_38 = cubeb_resampler_speex_one_way<float>::output(this_01,in_RSI,in_RDX);
      *in_RDX = (size_t)in_stack_ffffffffffffffa8;
    }
    local_8 = (cubeb_resampler_speex_one_way<float> *)
              (*(code *)(in_RDI->resampling_in_buffer).length_)
                        ((in_RDI->resampling_in_buffer).capacity_,
                         (in_RDI->resampling_out_buffer).data_,local_38,pcVar2,output_buffer);
    if (((long)output_buffer <= (long)local_8) ||
       (*(undefined1 *)&(in_RDI->resampling_out_buffer).capacity_ = 1, -1 < (long)local_8)) {
      std::
      unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
      ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                    *)0x119bf0);
      cubeb_resampler_speex_one_way<float>::written(local_8,(size_t)in_stack_ffffffffffffffa8);
      std::
      unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
      ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                    *)0x119c0b);
      cubeb_resampler_speex_one_way<float>::drop_audio_if_needed(local_8);
      std::
      unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
      ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                    *)0x119c21);
      local_8 = (cubeb_resampler_speex_one_way<float> *)
                cubeb_resampler_speex_one_way<float>::output(pcVar2,output_buffer,(size_t)local_8);
      std::
      unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
      ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                    *)0x119c46);
      cubeb_resampler_speex_one_way<float>::drop_audio_if_needed(local_8);
    }
  }
  else {
    std::
    unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
                  *)0x119a9b);
    local_8 = (cubeb_resampler_speex_one_way<float> *)
              cubeb_resampler_speex_one_way<float>::output
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0);
  }
  return (long)local_8;
}

Assistant:

long
cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::fill_internal_duplex(
    T * in_buffer, long * input_frames_count, T * out_buffer,
    long output_frames_needed)
{
  if (draining) {
    // discard input and drain any signal remaining in the resampler.
    return output_processor->output(out_buffer, output_frames_needed);
  }

  /* The input data, after eventual resampling. This is passed to the callback.
   */
  T * resampled_input = nullptr;
  /* The output buffer passed down in the callback, that might be resampled. */
  T * out_unprocessed = nullptr;
  long output_frames_before_processing = 0;
  /* The number of frames returned from the callback. */
  long got = 0;

  /* We need to determine how much frames to present to the consumer.
   * - If we have a two way stream, but we're only resampling input, we resample
   * the input to the number of output frames.
   * - If we have a two way stream, but we're only resampling the output, we
   * resize the input buffer of the output resampler to the number of input
   * frames, and we resample it afterwards.
   * - If we resample both ways, we resample the input to the number of frames
   * we would need to pass down to the consumer (before resampling the output),
   * get the output data, and resample it to the number of frames needed by the
   * caller. */

  output_frames_before_processing =
      output_processor->input_needed_for_output(output_frames_needed);
  /* fill directly the input buffer of the output processor to save a copy */
  out_unprocessed =
      output_processor->input_buffer(output_frames_before_processing);

  if (in_buffer) {
    /* process the input, and present exactly `output_frames_needed` in the
     * callback. */
    input_processor->input(in_buffer, *input_frames_count);

    size_t frames_resampled = 0;
    resampled_input = input_processor->output(output_frames_before_processing,
                                              &frames_resampled);
    *input_frames_count = frames_resampled;
  } else {
    resampled_input = nullptr;
  }

  got = data_callback(stream, user_ptr, resampled_input, out_unprocessed,
                      output_frames_before_processing);

  if (got < output_frames_before_processing) {
    draining = true;

    if (got < 0) {
      return got;
    }
  }

  output_processor->written(got);

  input_processor->drop_audio_if_needed();

  /* Process the output. If not enough frames have been returned from the
   * callback, drain the processors. */
  got = output_processor->output(out_buffer, output_frames_needed);

  output_processor->drop_audio_if_needed();

  return got;
}